

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-walker.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  Port *pPVar2;
  uint uVar3;
  allocator<char> local_439;
  long *local_438 [2];
  long local_428 [2];
  char buffer [1024];
  
  memset(buffer,0,0x400);
  uVar3 = 1;
  rtosc::walk_ports(&ports,buffer,0x400,(void *)0x0,
                    main::$_0::__invoke(rtosc::Port_const*,char_const*,char_const*,rtosc::
                    Ports_const__void__void__,true,(void *)0x0,false);
  pPVar2 = rtosc::Ports::apropos(&ports,"/subtree/port");
  if (pPVar2 != (Port *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_438,pPVar2->name,&local_439);
    iVar1 = std::__cxx11::string::compare((char *)local_438);
    uVar3 = (uint)(iVar1 != 0);
    if (local_438[0] != local_428) {
      operator_delete(local_438[0],local_428[0] + 1);
    }
  }
  return uVar3;
}

Assistant:

int main()
{
    char buffer[1024];
    memset(buffer, 0, sizeof(buffer));
    walk_ports(&ports, 
            buffer, 1024, NULL,
            [](const Port*, const char *name, const char*,
               const Ports&, void *, void*) {
                puts(name);
            });

    const Port *p = ports.apropos("/subtree/port");

    if(p && (std::string(p->name) == "port"))
        return 0;
    return 1;
}